

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer puVar1;
  pointer pcVar2;
  size_t __n;
  pointer pbVar3;
  string *psVar4;
  int iVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  pointer pbVar7;
  Option_p *opt;
  pointer puVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  stringstream out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_260;
  long *local_248 [2];
  long local_238 [2];
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string *local_1e0;
  Formatter *local_1d8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_1d0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1e0 = __return_storage_ptr__;
  local_1d8 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar8 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (app->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar1) {
    do {
      _Var6 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (puVar8->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      if (_Var6._M_current ==
          local_278.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_278,
                    (value_type *)
                    (puVar8->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      }
      pbVar3 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_228._M_unused._M_object = (void *)0x0;
        local_228._8_8_ = 0;
        local_218 = (code *)0x0;
        pcStack_210 = (code *)0x0;
        local_228._M_unused._M_object = operator_new(0x18);
        *(App **)local_228._M_unused._0_8_ = app;
        *(AppFormatMode *)((long)local_228._M_unused._0_8_ + 8) = mode;
        *(pointer *)((long)local_228._M_unused._0_8_ + 0x10) = pbVar7;
        pcStack_210 = std::
                      _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10810:61)>
                      ::_M_invoke;
        local_218 = std::
                    _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/helics/external/CLI11/CLI11.hpp:10810:61)>
                    ::_M_manager;
        App::get_options(&local_260,app,(function<bool_(const_CLI::Option_*)> *)&local_228);
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
        }
        if ((pbVar7->_M_string_length != 0) &&
           (local_260.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_260.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          local_248[0] = local_238;
          pcVar2 = (pbVar7->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar2,pcVar2 + pbVar7->_M_string_length);
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                    (&local_1d0,&local_260);
          (*(local_1d8->super_FormatterBase)._vptr_FormatterBase[3])
                    (&local_200,local_1d8,local_248,0,&local_1d0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_200,local_1f8);
          if (local_200 != local_1f0) {
            operator_delete(local_200,local_1f0[0] + 1);
          }
          if (local_1d0.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1d0.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d0.
                                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_248[0] != local_238) {
            operator_delete(local_248[0],local_238[0] + 1);
          }
          __n = pbVar7->_M_string_length;
          if ((__n != local_278.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) ||
             ((__n != 0 &&
              (iVar5 = bcmp((pbVar7->_M_dataplus)._M_p,
                            local_278.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,__n),
              iVar5 != 0)))) {
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          }
        }
        if (local_260.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_260.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_260.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_260.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar3);
    }
  }
  psVar4 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

CLI11_INLINE std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                     // Must be in the right group
                   && opt->nonpositional()                       // Must not be a positional
                   && (mode != AppFormatMode::Sub                // If mode is Sub, then
                       || (app->get_help_ptr() != opt            // Ignore help pointer
                           && app->get_help_all_ptr() != opt));  // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            if(group != groups.back())
                out << "\n";
        }
    }

    return out.str();
}